

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void djb::brdf::io_to_hd(vec3 *wi,vec3 *wo,vec3 *wh,vec3 *wd)

{
  vec3 vVar1;
  float_t phi_h;
  float_t theta_h;
  float_t local_78;
  float_t local_74;
  vec3 local_70;
  vec3 local_60;
  vec3 local_50;
  vec3 local_40;
  
  local_60.x = 0.0;
  local_60.y = 1.0;
  local_60.z = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 1.0;
  local_70 = operator+(wi,wo);
  vVar1 = normalize(&local_70);
  *wh = vVar1;
  xyz_to_theta_phi(wh,&local_74,&local_78);
  local_70 = rotate_vector(wi,&local_40,-local_78);
  local_50 = rotate_vector(&local_70,&local_60,-local_74);
  vVar1 = normalize(&local_50);
  *wd = vVar1;
  return;
}

Assistant:

void brdf::io_to_hd(const vec3 &wi, const vec3 &wo, vec3 *wh, vec3 *wd)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	(*wh) = normalize(wi + wo);
	xyz_to_theta_phi(*wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wi, z, -phi_h);
	(*wd) = normalize(rotate_vector(tmp, y, -theta_h));
}